

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio_util.c
# Opt level: O0

int ImgIoUtilReadFromStdin(uint8_t **data,size_t *data_size)

{
  int iVar1;
  FILE *pFVar2;
  void *pvVar3;
  size_t sVar4;
  ulong *in_RSI;
  undefined8 *in_RDI;
  void *new_data;
  size_t extra_size;
  uint8_t *input;
  size_t size;
  size_t max_size;
  size_t local_48;
  void *local_30;
  ulong local_28;
  ulong local_20;
  int local_4;
  
  local_20 = 0;
  local_28 = 0;
  local_30 = (void *)0x0;
  if ((in_RDI == (undefined8 *)0x0) || (in_RSI == (ulong *)0x0)) {
    local_4 = 0;
  }
  else {
    *in_RDI = 0;
    *in_RSI = 0;
    pFVar2 = ImgIoUtilSetBinaryMode((FILE *)_stdin);
    if (pFVar2 == (FILE *)0x0) {
      local_4 = 0;
    }
    else {
      do {
        iVar1 = feof(_stdin);
        if (iVar1 != 0) break;
        if (local_20 == 0) {
          local_48 = 0x4000;
        }
        else {
          local_48 = local_20;
        }
        pvVar3 = realloc(local_30,local_20 + local_48 + 1);
        if (pvVar3 == (void *)0x0) goto LAB_001068da;
        local_20 = local_48 + local_20;
        sVar4 = fread((void *)((long)pvVar3 + local_28),1,local_48,_stdin);
        local_28 = sVar4 + local_28;
        local_30 = pvVar3;
      } while (local_20 <= local_28);
      iVar1 = ferror(_stdin);
      if (iVar1 == 0) {
        if (local_30 != (void *)0x0) {
          *(undefined1 *)((long)local_30 + local_28) = 0;
        }
        *in_RDI = local_30;
        *in_RSI = local_28;
        local_4 = 1;
      }
      else {
LAB_001068da:
        free(local_30);
        fprintf(_stderr,"Could not read from stdin\n");
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int ImgIoUtilReadFromStdin(const uint8_t** data, size_t* data_size) {
  static const size_t kBlockSize = 16384;  // default initial size
  size_t max_size = 0;
  size_t size = 0;
  uint8_t* input = NULL;

  if (data == NULL || data_size == NULL) return 0;
  *data = NULL;
  *data_size = 0;

  if (!ImgIoUtilSetBinaryMode(stdin)) return 0;

  while (!feof(stdin)) {
    // We double the buffer size each time and read as much as possible.
    const size_t extra_size = (max_size == 0) ? kBlockSize : max_size;
    // we allocate one extra byte for the \0 terminator
    void* const new_data = realloc(input, max_size + extra_size + 1);
    if (new_data == NULL) goto Error;
    input = (uint8_t*)new_data;
    max_size += extra_size;
    size += fread(input + size, 1, extra_size, stdin);
    if (size < max_size) break;
  }
  if (ferror(stdin)) goto Error;
  if (input != NULL) input[size] = '\0';  // convenient 0-terminator
  *data = input;
  *data_size = size;
  return 1;

 Error:
  free(input);
  fprintf(stderr, "Could not read from stdin\n");
  return 0;
}